

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_105c52d::
BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int),_unsigned_short,_unsigned_short>
::RunTest(BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int),_unsigned_short,_unsigned_short>
          *this,int block_size,int run_times)

{
  long in_RDI;
  int in_stack_000000d0;
  int in_stack_000000d4;
  int in_stack_000000d8;
  int in_stack_000000dc;
  BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int),_unsigned_short,_unsigned_short>
  *in_stack_000000e0;
  
  *(undefined4 *)(in_RDI + 0xb0064) = 0;
  while (*(int *)(in_RDI + 0xb0064) < 2) {
    *(undefined4 *)(in_RDI + 0xb0060) = 0;
    while (*(int *)(in_RDI + 0xb0060) < 2) {
      RunOneTest(in_stack_000000e0,in_stack_000000dc,in_stack_000000d8,in_stack_000000d4,
                 in_stack_000000d0);
      *(int *)(in_RDI + 0xb0060) = *(int *)(in_RDI + 0xb0060) + 1;
    }
    *(int *)(in_RDI + 0xb0064) = *(int *)(in_RDI + 0xb0064) + 1;
  }
  return;
}

Assistant:

void RunTest(int block_size, int run_times) {
    for (subx_ = 0; subx_ <= 1; subx_++) {
      for (suby_ = 0; suby_ <= 1; suby_++) {
        RunOneTest(block_size, subx_, suby_, run_times);
      }
    }
  }